

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O2

void __thiscall env_var_not_defined::test_method(env_var_not_defined *this)

{
  bool bVar1;
  AuditEvent *pAVar2;
  undefined1 local_178 [24];
  char *local_160;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  long local_138 [2];
  shared_count sStack_128;
  EventRegistry registry;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  LicenseReader licenseReader;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  LicenseLocation location;
  
  location.licenseFileLocation = (char *)0x0;
  location.environmentVariableName = "MYVAR";
  location.openFileNearModule = false;
  license::LicenseReader::LicenseReader(&licenseReader,&location);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_178,"PRODUCT",(allocator *)local_138);
  license::LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_178,&licenseInfos);
  std::__cxx11::string::~string((string *)local_178);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x3c);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_138[0] = CONCAT71(local_138[0]._1_7_,!bVar1);
  local_138[1] = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_160 = (char *)&local_f8;
  local_f8 = "!registry.isGood()";
  local_f0 = "";
  local_178[8] = 0;
  local_178._0_8_ = &PTR__lazy_ostream_0059deb0;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion(local_138,local_178,&local_78,0x3c,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x3d);
  local_178[8] = 0;
  local_178._0_8_ = &PTR__lazy_ostream_0059df00;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_a0 = "";
  local_f8 = (char *)((ulong)local_f8 & 0xffffffff00000000);
  local_138[0] = (long)licenseInfos.
                       super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)licenseInfos.
                       super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (local_178,&local_a8,0x3d,1,2,&local_f8,"0",local_138,"licenseInfos.size()");
  pAVar2 = license::EventRegistry::getLastFailure(&registry);
  if (pAVar2 != (AuditEvent *)0x0) {
    local_b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_b0 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x40);
    local_178[8] = 0;
    local_178._0_8_ = &PTR__lazy_ostream_0059df00;
    local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_160 = "";
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_100 = "";
    local_138[0] = CONCAT44(local_138[0]._4_4_,3);
    pAVar2 = license::EventRegistry::getLastFailure(&registry);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,EVENT_TYPE,EVENT_TYPE>
              (local_178,&local_108,0x40,1,2,local_138,"ENVIRONMENT_VARIABLE_NOT_DEFINED",
               &pAVar2->event_type,"registry.getLastFailure()->event_type");
    std::_Vector_base<AuditEvent,_std::allocator<AuditEvent>_>::~_Vector_base
              ((_Vector_base<AuditEvent,_std::allocator<AuditEvent>_> *)&registry);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenseInfos);
    license::LicenseReader::~LicenseReader(&licenseReader);
    return;
  }
  __assert_fail("registry.getLastFailure()!=__null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
                ,0x3e,"void env_var_not_defined::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE( env_var_not_defined ) {
	const char * envName = "MYVAR";
	const LicenseLocation location = { NULL, envName, false };
	LicenseReader licenseReader(location);
	vector<FullLicenseInfo> licenseInfos;
	EventRegistry registry = licenseReader.readLicenses("PRODUCT",
			licenseInfos);
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure()!=NULL);
	BOOST_CHECK_EQUAL(ENVIRONMENT_VARIABLE_NOT_DEFINED,
			registry.getLastFailure()->event_type);
}